

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O2

bool arangodb::velocypack::Collection::contains(Slice slice,Slice other)

{
  ValueLength VVar1;
  ValueLength VVar2;
  bool bVar3;
  ArrayIterator it;
  uint8_t *local_58;
  uint8_t *local_50;
  ArrayIterator local_48;
  
  local_50 = other._start;
  ArrayIterator::ArrayIterator(&local_48,slice);
  while( true ) {
    VVar2 = local_48._position;
    VVar1 = local_48._size;
    if (local_48._position == local_48._size) break;
    local_58 = (uint8_t *)ArrayIterator::value(&local_48);
    bVar3 = SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
            binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
                      ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                       &local_58,
                       (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_50);
    if (bVar3) break;
    ArrayIterator::next(&local_48);
  }
  return VVar2 != VVar1;
}

Assistant:

bool Collection::contains(Slice slice, Slice other) {
  ArrayIterator it(slice);

  while (it.valid()) {
    if (it.value().binaryEquals(other)) {
      return true;
    }
    it.next();
  }

  return false;
}